

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_d2.cc
# Opt level: O2

int X509_STORE_set_default_paths(X509_STORE *ctx)

{
  X509_LOOKUP_METHOD *pXVar1;
  X509_LOOKUP *pXVar2;
  int iVar3;
  
  pXVar1 = X509_LOOKUP_file();
  pXVar2 = X509_STORE_add_lookup(ctx,pXVar1);
  iVar3 = 0;
  if (pXVar2 != (X509_LOOKUP *)0x0) {
    X509_LOOKUP_load_file((X509_LOOKUP *)pXVar2,(char *)0x0,3);
    pXVar1 = X509_LOOKUP_hash_dir();
    pXVar2 = X509_STORE_add_lookup(ctx,pXVar1);
    if (pXVar2 != (X509_LOOKUP *)0x0) {
      X509_LOOKUP_add_dir((X509_LOOKUP *)pXVar2,(char *)0x0,3);
      ERR_clear_error();
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int X509_STORE_set_default_paths(X509_STORE *ctx) {
  X509_LOOKUP *lookup;

  lookup = X509_STORE_add_lookup(ctx, X509_LOOKUP_file());
  if (lookup == NULL) {
    return 0;
  }
  X509_LOOKUP_load_file(lookup, NULL, X509_FILETYPE_DEFAULT);

  lookup = X509_STORE_add_lookup(ctx, X509_LOOKUP_hash_dir());
  if (lookup == NULL) {
    return 0;
  }
  X509_LOOKUP_add_dir(lookup, NULL, X509_FILETYPE_DEFAULT);

  // clear any errors
  ERR_clear_error();

  return 1;
}